

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O2

qint64 __thiscall
QUdpSocket::readDatagram
          (QUdpSocket *this,char *data,qint64 maxSize,QHostAddress *address,quint16 *port)

{
  long lVar1;
  QAbstractSocketPrivate *this_00;
  bool bVar2;
  SocketError errorCode;
  qint64 qVar3;
  long in_FS_OFFSET;
  QHostAddress local_70;
  QIpPacketHeader header;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&(this->super_QAbstractSocket).field_0x8;
  bVar2 = QAbstractSocket::isValid(&this->super_QAbstractSocket);
  if (bVar2) {
    if (address == (QHostAddress *)0x0 && port == (quint16 *)0x0) {
      qVar3 = (**(code **)(*(long *)this_00->socketEngine + 0xf8))
                        (this_00->socketEngine,data,maxSize,0,0);
    }
    else {
      header._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      header.ifindex = 0xaaaaaaaa;
      header.hopLimit = -0x55555556;
      header._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      header.senderAddress.d.d.ptr._0_4_ = 0xaaaaaaaa;
      header.senderAddress.d.d.ptr._4_4_ = 0xaaaaaaaa;
      header.destinationAddress.d.d.ptr._0_4_ = 0xaaaaaaaa;
      header.destinationAddress.d.d.ptr._4_4_ = 0xaaaaaaaa;
      QHostAddress::QHostAddress(&local_70);
      QIpPacketHeader::QIpPacketHeader(&header,&local_70,0);
      QHostAddress::~QHostAddress(&local_70);
      qVar3 = (**(code **)(*(long *)this_00->socketEngine + 0xf8))
                        (this_00->socketEngine,data,maxSize,&header,1);
      if (address != (QHostAddress *)0x0) {
        QHostAddress::operator=(address,&header.senderAddress);
      }
      if (port != (quint16 *)0x0) {
        *port = header.senderPort;
      }
      QIpPacketHeader::~QIpPacketHeader(&header);
    }
    this_00->hasPendingData = false;
    this_00->hasPendingDatagram = false;
    (**(code **)(*(long *)this_00->socketEngine + 0x140))(this_00->socketEngine,1);
    if (-1 < qVar3) goto LAB_001bc511;
    if (qVar3 != -2) {
      errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketEngine::errorString
                ((QString *)&header,(QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketPrivate::setErrorAndEmit(this_00,errorCode,(QString *)&header);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&header);
      goto LAB_001bc511;
    }
    tr((QString *)&header,"No datagram available for reading",(char *)0x0,-1);
    QAbstractSocketPrivate::setErrorAndEmit(this_00,TemporaryError,(QString *)&header);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&header);
  }
  else {
    header.senderAddress.d.d.ptr._0_4_ = 2;
    header.hopLimit = 0;
    header.senderAddress.d.d.ptr._4_4_ = 0;
    header.destinationAddress.d.d.ptr._0_4_ = 0;
    header.destinationAddress.d.d.ptr._4_4_ = 0;
    header.ifindex = 0;
    header._24_8_ = anon_var_dwarf_9aede;
    QMessageLogger::warning
              ((char *)&header,
               "QUdpSocket::readDatagram() called on a QUdpSocket when not in QUdpSocket::BoundState"
              );
  }
  qVar3 = -1;
LAB_001bc511:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar3;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUdpSocket::readDatagram(char *data, qint64 maxSize, QHostAddress *address,
                                    quint16 *port)
{
    Q_D(QUdpSocket);

#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::readDatagram(%p, %llu, %p, %p)", data, maxSize, address, port);
#endif
    QT_CHECK_BOUND("QUdpSocket::readDatagram()", -1);

    qint64 readBytes;
    if (address || port) {
        QIpPacketHeader header;
        readBytes = d->socketEngine->readDatagram(data, maxSize, &header,
                                                  QAbstractSocketEngine::WantDatagramSender);
        if (address)
            *address = header.senderAddress;
        if (port)
            *port = header.senderPort;
    } else {
        readBytes = d->socketEngine->readDatagram(data, maxSize);
    }

    d->hasPendingData = false;
    d->hasPendingDatagram = false;
    d->socketEngine->setReadNotificationEnabled(true);
    if (readBytes < 0) {
        if (readBytes == -2) {
            // No pending datagram. Treat as a temporary error.
            d->setErrorAndEmit(QAbstractSocket::TemporaryError,
                               tr("No datagram available for reading"));
            return -1;
        }
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
    }
    return readBytes;
}